

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_maybe_deferred_bind(uv_udp_t *handle,int domain,uint flags)

{
  uint addrlen;
  int iVar1;
  sockaddr_in6 *addr;
  anon_union_28_3_c0956edd taddr;
  
  iVar1 = 0;
  if ((handle->io_watcher).fd == -1) {
    if (domain == 10) {
      taddr.in6.sin6_scope_id = 0;
      taddr._0_8_ = 10;
      taddr._8_4_ = (undefined4)_in6addr_any;
      taddr._12_4_ = (undefined4)((ulong)_in6addr_any >> 0x20);
      taddr._16_4_ = (undefined4)___dynamic_cast;
      taddr._20_4_ = (undefined4)((ulong)___dynamic_cast >> 0x20);
      addrlen = 0x1c;
    }
    else {
      if (domain != 2) {
        __assert_fail("0 && \"unsupported address family\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x178,"int uv__udp_maybe_deferred_bind(uv_udp_t *, int, unsigned int)");
      }
      taddr._8_4_ = 0;
      taddr._12_4_ = 0;
      taddr._0_8_ = 2;
      addrlen = 0x10;
    }
    iVar1 = uv__udp_bind(handle,&taddr.addr,addrlen,flags);
  }
  return iVar1;
}

Assistant:

static int uv__udp_maybe_deferred_bind(uv_udp_t* handle,
                                       int domain,
                                       unsigned int flags) {
  union {
    struct sockaddr_in6 in6;
    struct sockaddr_in in;
    struct sockaddr addr;
  } taddr;
  socklen_t addrlen;

  if (handle->io_watcher.fd != -1)
    return 0;

  switch (domain) {
  case AF_INET:
  {
    struct sockaddr_in* addr = &taddr.in;
    memset(addr, 0, sizeof *addr);
    addr->sin_family = AF_INET;
    addr->sin_addr.s_addr = INADDR_ANY;
    addrlen = sizeof *addr;
    break;
  }
  case AF_INET6:
  {
    struct sockaddr_in6* addr = &taddr.in6;
    memset(addr, 0, sizeof *addr);
    addr->sin6_family = AF_INET6;
    addr->sin6_addr = in6addr_any;
    addrlen = sizeof *addr;
    break;
  }
  default:
    assert(0 && "unsupported address family");
    abort();
  }

  return uv__udp_bind(handle, &taddr.addr, addrlen, flags);
}